

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BeagleCPUImpl.hpp
# Opt level: O2

void __thiscall
beagle::cpu::BeagleCPUImpl<double,_1,_0>::calcPartialsPartialsFixedScaling
          (BeagleCPUImpl<double,_1,_0> *this,double *destP,double *partials1,double *matrices1,
          double *partials2,double *matrices2,double *scaleFactors,int startPattern,int endPattern)

{
  double dVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  double *pdVar11;
  int iVar12;
  double *pdVar13;
  double *pdVar14;
  double *pdVar15;
  int iVar16;
  double *pdVar17;
  long lVar18;
  ulong uVar19;
  double *pdVar20;
  long lVar21;
  ulong uVar22;
  long lVar23;
  double *pdVar24;
  double *pdVar25;
  double *pdVar26;
  long lVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  double *local_c8;
  double *local_c0;
  double *local_b8;
  double *local_b0;
  long local_a8;
  
  uVar4 = this->kStateCount;
  uVar5 = this->kCategoryCount;
  iVar16 = uVar4 + 1;
  iVar6 = this->kPatternCount;
  iVar7 = this->kPartialsPaddedStateCount;
  lVar23 = (long)iVar7;
  iVar8 = this->kMatrixSize;
  local_c8 = matrices1 + 3;
  local_c0 = matrices2 + 3;
  iVar12 = startPattern * iVar7;
  local_b8 = matrices1;
  local_b0 = matrices2;
  for (uVar19 = 0; uVar19 != (~((int)uVar5 >> 0x1f) & uVar5); uVar19 = uVar19 + 1) {
    local_a8 = 0;
    pdVar17 = destP + (iVar6 * (int)uVar19 + startPattern) * iVar7;
    pdVar13 = partials2 + iVar12;
    pdVar14 = partials1 + iVar12;
    for (lVar21 = (long)startPattern; lVar21 < endPattern; lVar21 = lVar21 + 1) {
      dVar1 = scaleFactors[lVar21];
      pdVar15 = local_c8;
      pdVar20 = local_b0;
      pdVar24 = local_b8;
      pdVar26 = local_c0;
      for (uVar22 = 0; uVar22 != (~((int)uVar4 >> 0x1f) & uVar4); uVar22 = uVar22 + 1) {
        auVar28 = ZEXT816(0) << 0x40;
        lVar18 = 0;
        pdVar11 = pdVar24;
        pdVar25 = pdVar20;
        lVar27 = local_a8;
        while (lVar18 < (int)uVar4 / 4 << 2) {
          lVar27 = lVar27 + 0x20;
          pdVar25 = pdVar25 + 4;
          pdVar11 = pdVar11 + 4;
          auVar30._16_16_ = *(undefined1 (*) [16])(pdVar26 + lVar18 + -3);
          auVar30._0_16_ = *(undefined1 (*) [16])(pdVar15 + lVar18 + -3);
          auVar32._16_16_ = *(undefined1 (*) [16])(pdVar13 + lVar18);
          auVar32._0_16_ = *(undefined1 (*) [16])(pdVar14 + lVar18);
          auVar28 = vfmadd213pd_fma(auVar32,auVar30,ZEXT1632(auVar28));
          auVar31._16_16_ = *(undefined1 (*) [16])(pdVar26 + lVar18 + -1);
          auVar31._0_16_ = *(undefined1 (*) [16])(pdVar15 + lVar18 + -1);
          auVar29._16_16_ = *(undefined1 (*) [16])(pdVar13 + lVar18 + 2);
          auVar29._0_16_ = *(undefined1 (*) [16])(pdVar14 + lVar18 + 2);
          lVar18 = lVar18 + 4;
          auVar28 = vfmadd213pd_fma(auVar29,auVar31,ZEXT1632(auVar28));
        }
        auVar10 = (undefined1  [16])0x0;
        auVar9 = auVar28;
        while (lVar18 < (int)uVar4) {
          auVar33._8_8_ = 0;
          auVar33._0_8_ = *pdVar11;
          auVar34._8_8_ = 0;
          auVar34._0_8_ = *pdVar25;
          lVar18 = lVar18 + 1;
          pdVar25 = pdVar25 + 1;
          pdVar11 = pdVar11 + 1;
          auVar2._8_8_ = 0;
          auVar2._0_8_ = *(ulong *)((long)(partials1 + iVar12) + lVar27);
          auVar9 = vfmadd231sd_fma(auVar9,auVar33,auVar2);
          auVar3._8_8_ = 0;
          auVar3._0_8_ = *(ulong *)((long)(partials2 + iVar12) + lVar27);
          auVar10 = vfmadd231sd_fma(auVar10,auVar34,auVar3);
          lVar27 = lVar27 + 8;
        }
        auVar28 = vshufpd_avx(auVar28,auVar28,1);
        auVar2 = vshufpd_avx((undefined1  [16])0x0,(undefined1  [16])0x0,1);
        pdVar26 = pdVar26 + iVar16;
        pdVar15 = pdVar15 + iVar16;
        pdVar20 = pdVar20 + iVar16;
        pdVar24 = pdVar24 + iVar16;
        *pdVar17 = (1.0 / dVar1) * (auVar28._0_8_ + auVar9._0_8_) * (auVar2._0_8_ + auVar10._0_8_);
        pdVar17 = pdVar17 + 1;
      }
      local_a8 = local_a8 + lVar23 * 8;
      pdVar13 = pdVar13 + lVar23;
      pdVar14 = pdVar14 + lVar23;
    }
    iVar12 = iVar12 + iVar6 * iVar7;
    local_c0 = local_c0 + iVar8;
    local_c8 = local_c8 + iVar8;
    local_b0 = local_b0 + iVar8;
    local_b8 = local_b8 + iVar8;
  }
  return;
}

Assistant:

BEAGLE_CPU_TEMPLATE
void BeagleCPUImpl<BEAGLE_CPU_GENERIC>::calcPartialsPartialsFixedScaling(REALTYPE* destP,
                                                                         const REALTYPE* partials1,
                                                                         const REALTYPE* matrices1,
                                                                         const REALTYPE* partials2,
                                                                         const REALTYPE* matrices2,
                                                                         const REALTYPE* scaleFactors,
                                                                         int startPattern,
                                                                         int endPattern) {

    int matrixIncr = kStateCount;

    // increment for the extra column at the end
    matrixIncr += T_PAD;

    int stateCountModFour = (kStateCount / 4) * 4;

#pragma omp parallel for num_threads(kCategoryCount)
    for (int l = 0; l < kCategoryCount; l++) {
        int v = l*kPartialsPaddedStateCount*kPatternCount + kPartialsPaddedStateCount*startPattern;
        int matrixOffset = l*kMatrixSize;
        const REALTYPE* partials1Ptr = &partials1[v];
        const REALTYPE* partials2Ptr = &partials2[v];
        REALTYPE* destPtr = &destP[v];
        for (int k = startPattern; k < endPattern; k++) {
            REALTYPE oneOverScaleFactor = REALTYPE(1.0) / scaleFactors[k];
            for (int i = 0; i < kStateCount; i++) {
                const REALTYPE* matrices1Ptr = matrices1 + matrixOffset + i * matrixIncr;
                const REALTYPE* matrices2Ptr = matrices2 + matrixOffset + i * matrixIncr;
                REALTYPE sum1A = 0.0, sum2A = 0.0;
                REALTYPE sum1B = 0.0, sum2B = 0.0;
                int j = 0;
                for (; j < stateCountModFour; j += 4) {
                    sum1A += matrices1Ptr[j + 0] * partials1Ptr[j + 0];
                    sum2A += matrices2Ptr[j + 0] * partials2Ptr[j + 0];

                    sum1B += matrices1Ptr[j + 1] * partials1Ptr[j + 1];
                    sum2B += matrices2Ptr[j + 1] * partials2Ptr[j + 1];

                    sum1A += matrices1Ptr[j + 2] * partials1Ptr[j + 2];
                    sum2A += matrices2Ptr[j + 2] * partials2Ptr[j + 2];

                    sum1B += matrices1Ptr[j + 3] * partials1Ptr[j + 3];
                    sum2B += matrices2Ptr[j + 3] * partials2Ptr[j + 3];
                }

                for (; j < kStateCount; j++) {
                    sum1A += matrices1Ptr[j] * partials1Ptr[j];
                    sum2A += matrices2Ptr[j] * partials2Ptr[j];
                }

                *(destPtr++) = (sum1A + sum1B) * (sum2A + sum2B) * oneOverScaleFactor;
            }
            destPtr += P_PAD;
            partials1Ptr += kPartialsPaddedStateCount;
            partials2Ptr += kPartialsPaddedStateCount;
        }
    }
}